

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O2

void __thiscall Imf_2_5::MultiViewChannelName::~MultiViewChannelName(MultiViewChannelName *this)

{
  this->_vptr_MultiViewChannelName = (_func_int **)&PTR__MultiViewChannelName_00420ab0;
  std::__cxx11::string::~string((string *)&this->internal_name);
  std::__cxx11::string::~string((string *)&this->view);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~MultiViewChannelName() {}